

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  _Base_ptr p_Var6;
  int *piVar7;
  char *pcVar8;
  allocator<char> local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string tempDir;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  suites;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests;
  
  tempDir._M_dataplus._M_p = (pointer)&tempDir.field_2;
  tempDir._M_string_length = 0;
  tempDir.field_2._M_local_buf[0] = '\0';
  if (argc == 2) {
    pcVar8 = argv[1];
    iVar4 = strcmp(pcVar8,"--help");
    if ((iVar4 != 0) && (((*pcVar8 != '-' || (pcVar8[1] != 'h')) || (pcVar8[2] != '\0'))))
    goto LAB_001278fa;
    bVar3 = true;
  }
  else {
LAB_001278fa:
    bVar3 = false;
  }
  p_Var2 = &tests._M_t._M_impl.super__Rb_tree_header;
  tests._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  tests._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  tests._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &suites._M_t._M_impl.super__Rb_tree_header;
  suites._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  suites._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  suites._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  suites._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  suites._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  tests._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  tests._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"testBase",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"core",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testBaseErrors",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"core",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testBaseLimits",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"core",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testBaseDebug",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"core",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"testXDR",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"core",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testBufferCompression",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"core",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testAttrSizes",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"gen_attr",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testAttrStrings",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"gen_attr",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testAttrStringVectors",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"gen_attr",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testAttrFloatVectors",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"gen_attr",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testAttrChlists",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"gen_attr",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testAttrPreview",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"gen_attr",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testAttrOpaque",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"gen_attr",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testAttrHandler",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"gen_attr",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testAttrLists",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"gen_attr",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testReadBadArgs",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"core_read",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testReadBadFiles",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"core_read",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"testReadMeta",&local_c9)
    ;
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"core_read",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testOpenScans",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"core_read",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testOpenTiles",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"core_read",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testOpenMultiPart",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"core_read",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"testOpenDeep",&local_c9)
    ;
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"core_read",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testReadScans",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"core_read",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testReadTiles",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"core_read",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testReadMultiPart",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"core_read",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"testReadDeep",&local_c9)
    ;
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"core_read",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testReadUnpack",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"core_read",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testWriteBadArgs",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"core_write",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testWriteBadFiles",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"core_write",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testUpdateMeta",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"core_write",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testWriteBaseHeader",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"core_write",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testWriteAttrs",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"core_write",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testStartWriteScan",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"core_write",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testStartWriteTile",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"core_write",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testStartWriteDeepScan",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"core_write",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testStartWriteDeepTile",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"core_write",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testWriteScans",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"core_write",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testWriteTiles",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"core_write",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testWriteMultiPart",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"core_write",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testWriteDeep",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"core_write",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"testHUF",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"core_compression",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testNoCompression",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"core_compression",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testRLECompression",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"core_compression",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testZIPCompression",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"core_compression",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testZIPSCompression",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"core_compression",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testPIZCompression",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"core_compression",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testPXR24Compression",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"core_compression",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testB44Compression",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"core_compression",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testB44ACompression",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"core_compression",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testDWAACompression",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"core_compression",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testDWABCompression",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"core_compression",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testDeepNoCompression",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"core_compression",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testDeepZIPCompression",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"core_compression",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"testDeepZIPSCompression",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&tests,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"core_compression",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&suites,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::operator<<((ostream *)&std::cout,
                    "OpenEXR Core Test runs a series of tests to confirm\ncorrect behavior of the core low-level OpenEXR library.\nIf all is correct, OpenEXRCoreTest will complete without\ncrashing or leaking memory.\n"
                   );
    std::operator<<((ostream *)&std::cout,"\n");
    std::operator<<((ostream *)&std::cout,
                    "If a test fails, an individual test can be re-run, avoiding\nthe wait for previous tests to complete. This allows easier debugging\nof the failure.\n"
                   );
    std::operator<<((ostream *)&std::cout,"\n");
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "A \'suite\' of tests can also be run, to allow a subset of\n");
    poVar5 = std::operator<<(poVar5,"tests to run. This is useful as an initial confirmation\n");
    poVar5 = std::operator<<(poVar5,
                             "that a modification to the library has not introduced an error.\n");
    std::operator<<(poVar5,"Suites can be run in parallel for speed. Every test is in one suite.\n")
    ;
    std::operator<<((ostream *)&std::cout,"\n");
    poVar5 = std::operator<<((ostream *)&std::cout,"usage:\n");
    poVar5 = std::operator<<(poVar5,"OpenEXRCoreTest           : with no arguments, run all tests\n"
                            );
    poVar5 = std::operator<<(poVar5,
                             "OpenEXRCoreTest TEST      : run only specific test, then quit\n");
    std::operator<<(poVar5,"OpenEXRCoreTest SUITE     : run all the tests in the given SUITE\n");
    std::operator<<((ostream *)&std::cout,"\n");
    std::operator<<((ostream *)&std::cout,"available TESTs:\n");
    for (p_Var6 = tests._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != p_Var2; p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      poVar5 = std::operator<<((ostream *)&std::cout,' ');
      poVar5 = std::operator<<(poVar5,(string *)(p_Var6 + 1));
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    std::operator<<((ostream *)&std::cout,"\n");
    std::operator<<((ostream *)&std::cout,"available SUITEs:\n");
    for (p_Var6 = suites._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != p_Var1; p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      poVar5 = std::operator<<((ostream *)&std::cout,' ');
      poVar5 = std::operator<<(poVar5,(string *)(p_Var6 + 1));
      std::endl<char,std::char_traits<char>>(poVar5);
    }
  }
  else {
    makeTempDir_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&tempDir,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    if (argc < 2) {
LAB_00128f5a:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testBase");
      std::endl<char,std::char_traits<char>>(poVar5);
      testBase(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_00128f97;
      }
LAB_00128fbd:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testBaseErrors");
      std::endl<char,std::char_traits<char>>(poVar5);
      testBaseErrors(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_00128ffa;
      }
LAB_00129020:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testBaseLimits");
      std::endl<char,std::char_traits<char>>(poVar5);
      testBaseLimits(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_0012905d;
      }
LAB_00129083:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testBaseDebug");
      std::endl<char,std::char_traits<char>>(poVar5);
      testBaseDebug(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_001290c0;
      }
LAB_001290e6:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testXDR");
      std::endl<char,std::char_traits<char>>(poVar5);
      testXDR(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_00129123;
      }
LAB_00129149:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testBufferCompression");
      std::endl<char,std::char_traits<char>>(poVar5);
      testBufferCompression(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_00129186;
      }
LAB_001291ac:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testAttrSizes");
      std::endl<char,std::char_traits<char>>(poVar5);
      testAttrSizes(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_001291e9;
      }
LAB_0012920f:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testAttrStrings");
      std::endl<char,std::char_traits<char>>(poVar5);
      testAttrStrings(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_0012924c;
      }
LAB_00129272:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testAttrStringVectors");
      std::endl<char,std::char_traits<char>>(poVar5);
      testAttrStringVectors(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_001292af;
      }
LAB_001292d5:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testAttrFloatVectors");
      std::endl<char,std::char_traits<char>>(poVar5);
      testAttrFloatVectors(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_00129312;
      }
LAB_00129338:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testAttrChlists");
      std::endl<char,std::char_traits<char>>(poVar5);
      testAttrChlists(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_00129375;
      }
LAB_0012939b:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testAttrPreview");
      std::endl<char,std::char_traits<char>>(poVar5);
      testAttrPreview(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_001293d8;
      }
LAB_001293fe:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testAttrOpaque");
      std::endl<char,std::char_traits<char>>(poVar5);
      testAttrOpaque(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_0012943b;
      }
LAB_00129461:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testAttrHandler");
      std::endl<char,std::char_traits<char>>(poVar5);
      testAttrHandler(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_0012949e;
      }
LAB_001294c4:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testAttrLists");
      std::endl<char,std::char_traits<char>>(poVar5);
      testAttrLists(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_00129501;
      }
LAB_00129527:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testReadBadArgs");
      std::endl<char,std::char_traits<char>>(poVar5);
      testReadBadArgs(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_00129564;
      }
LAB_0012958a:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testReadBadFiles");
      std::endl<char,std::char_traits<char>>(poVar5);
      testReadBadFiles(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_001295c7;
      }
LAB_001295ed:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testReadMeta");
      std::endl<char,std::char_traits<char>>(poVar5);
      testReadMeta(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_0012962a;
      }
LAB_00129650:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testOpenScans");
      std::endl<char,std::char_traits<char>>(poVar5);
      testOpenScans(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_0012968d;
      }
LAB_001296b3:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testOpenTiles");
      std::endl<char,std::char_traits<char>>(poVar5);
      testOpenTiles(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_001296f0;
      }
LAB_00129716:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testOpenMultiPart");
      std::endl<char,std::char_traits<char>>(poVar5);
      testOpenMultiPart(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_00129753;
      }
LAB_00129779:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testOpenDeep");
      std::endl<char,std::char_traits<char>>(poVar5);
      testOpenDeep(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_001297b6;
      }
LAB_001297dc:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testReadScans");
      std::endl<char,std::char_traits<char>>(poVar5);
      testReadScans(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_00129819;
      }
LAB_0012983f:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testReadTiles");
      std::endl<char,std::char_traits<char>>(poVar5);
      testReadTiles(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_0012987c;
      }
LAB_001298a2:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testReadMultiPart");
      std::endl<char,std::char_traits<char>>(poVar5);
      testReadMultiPart(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_001298df;
      }
LAB_00129905:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testReadDeep");
      std::endl<char,std::char_traits<char>>(poVar5);
      testReadDeep(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_00129942;
      }
LAB_00129968:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testReadUnpack");
      std::endl<char,std::char_traits<char>>(poVar5);
      testReadUnpack(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_001299a5;
      }
LAB_001299cb:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testWriteBadArgs");
      std::endl<char,std::char_traits<char>>(poVar5);
      testWriteBadArgs(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_00129a08;
      }
LAB_00129a2e:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testWriteBadFiles");
      std::endl<char,std::char_traits<char>>(poVar5);
      testWriteBadFiles(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_00129a6b;
      }
LAB_00129a91:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testUpdateMeta");
      std::endl<char,std::char_traits<char>>(poVar5);
      testUpdateMeta(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_00129ace;
      }
LAB_00129af4:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testWriteBaseHeader");
      std::endl<char,std::char_traits<char>>(poVar5);
      testWriteBaseHeader(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_00129b31;
      }
LAB_00129b57:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testWriteAttrs");
      std::endl<char,std::char_traits<char>>(poVar5);
      testWriteAttrs(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_00129b94;
      }
LAB_00129bba:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testStartWriteScan");
      std::endl<char,std::char_traits<char>>(poVar5);
      testStartWriteScan(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_00129bf7;
      }
LAB_00129c1d:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testStartWriteTile");
      std::endl<char,std::char_traits<char>>(poVar5);
      testStartWriteTile(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_00129c5a;
      }
LAB_00129c80:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testStartWriteDeepScan");
      std::endl<char,std::char_traits<char>>(poVar5);
      testStartWriteDeepScan(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_00129cbd;
      }
LAB_00129ce3:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testStartWriteDeepTile");
      std::endl<char,std::char_traits<char>>(poVar5);
      testStartWriteDeepTile(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_00129d20;
      }
LAB_00129d46:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testWriteScans");
      std::endl<char,std::char_traits<char>>(poVar5);
      testWriteScans(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_00129d83;
      }
LAB_00129da9:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testWriteTiles");
      std::endl<char,std::char_traits<char>>(poVar5);
      testWriteTiles(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_00129de6;
      }
LAB_00129e0c:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testWriteMultiPart");
      std::endl<char,std::char_traits<char>>(poVar5);
      testWriteMultiPart(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_00129e49;
      }
LAB_00129e6f:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testWriteDeep");
      std::endl<char,std::char_traits<char>>(poVar5);
      testWriteDeep(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_00129eac;
      }
LAB_00129ed2:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testHUF");
      std::endl<char,std::char_traits<char>>(poVar5);
      testHUF(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_00129f0f;
      }
LAB_00129f35:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testNoCompression");
      std::endl<char,std::char_traits<char>>(poVar5);
      testNoCompression(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_00129f72;
      }
LAB_00129f98:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testRLECompression");
      std::endl<char,std::char_traits<char>>(poVar5);
      testRLECompression(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_00129fd5;
      }
LAB_00129ffb:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testZIPCompression");
      std::endl<char,std::char_traits<char>>(poVar5);
      testZIPCompression(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_0012a038;
      }
LAB_0012a05e:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testZIPSCompression");
      std::endl<char,std::char_traits<char>>(poVar5);
      testZIPSCompression(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_0012a09b;
      }
LAB_0012a0c1:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testPIZCompression");
      std::endl<char,std::char_traits<char>>(poVar5);
      testPIZCompression(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_0012a0fe;
      }
LAB_0012a124:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testPXR24Compression");
      std::endl<char,std::char_traits<char>>(poVar5);
      testPXR24Compression(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_0012a161;
      }
LAB_0012a187:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testB44Compression");
      std::endl<char,std::char_traits<char>>(poVar5);
      testB44Compression(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_0012a1c4;
      }
LAB_0012a1ea:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testB44ACompression");
      std::endl<char,std::char_traits<char>>(poVar5);
      testB44ACompression(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_0012a227;
      }
LAB_0012a24d:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testDWAACompression");
      std::endl<char,std::char_traits<char>>(poVar5);
      testDWAACompression(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_0012a28a;
      }
LAB_0012a2b0:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testDWABCompression");
      std::endl<char,std::char_traits<char>>(poVar5);
      testDWABCompression(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_0012a2ed;
      }
LAB_0012a313:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testDeepNoCompression");
      std::endl<char,std::char_traits<char>>(poVar5);
      testDeepNoCompression(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_0012a350;
      }
LAB_0012a376:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testDeepZIPCompression");
      std::endl<char,std::char_traits<char>>(poVar5);
      testDeepZIPCompression(&tempDir);
      if (1 < argc) {
        pcVar8 = argv[1];
        goto LAB_0012a3b3;
      }
LAB_0012a3d9:
      poVar5 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar5 = std::operator<<(poVar5,"testDeepZIPSCompression");
      std::endl<char,std::char_traits<char>>(poVar5);
      testDeepZIPSCompression(&tempDir);
    }
    else {
      pcVar8 = argv[1];
      iVar4 = strcmp(pcVar8,"testBase");
      if (iVar4 == 0) goto LAB_00128f5a;
      iVar4 = strcmp(pcVar8,"core");
      if (iVar4 == 0) goto LAB_00128f5a;
LAB_00128f97:
      iVar4 = strcmp(pcVar8,"testBaseErrors");
      if (iVar4 == 0) goto LAB_00128fbd;
      iVar4 = strcmp(pcVar8,"core");
      if (iVar4 == 0) goto LAB_00128fbd;
LAB_00128ffa:
      iVar4 = strcmp(pcVar8,"testBaseLimits");
      if (iVar4 == 0) goto LAB_00129020;
      iVar4 = strcmp(pcVar8,"core");
      if (iVar4 == 0) goto LAB_00129020;
LAB_0012905d:
      iVar4 = strcmp(pcVar8,"testBaseDebug");
      if (iVar4 == 0) goto LAB_00129083;
      iVar4 = strcmp(pcVar8,"core");
      if (iVar4 == 0) goto LAB_00129083;
LAB_001290c0:
      iVar4 = strcmp(pcVar8,"testXDR");
      if (iVar4 == 0) goto LAB_001290e6;
      iVar4 = strcmp(pcVar8,"core");
      if (iVar4 == 0) goto LAB_001290e6;
LAB_00129123:
      iVar4 = strcmp(pcVar8,"testBufferCompression");
      if (iVar4 == 0) goto LAB_00129149;
      iVar4 = strcmp(pcVar8,"core");
      if (iVar4 == 0) goto LAB_00129149;
LAB_00129186:
      iVar4 = strcmp(pcVar8,"testAttrSizes");
      if (iVar4 == 0) goto LAB_001291ac;
      iVar4 = strcmp(pcVar8,"gen_attr");
      if (iVar4 == 0) goto LAB_001291ac;
LAB_001291e9:
      iVar4 = strcmp(pcVar8,"testAttrStrings");
      if (iVar4 == 0) goto LAB_0012920f;
      iVar4 = strcmp(pcVar8,"gen_attr");
      if (iVar4 == 0) goto LAB_0012920f;
LAB_0012924c:
      iVar4 = strcmp(pcVar8,"testAttrStringVectors");
      if (iVar4 == 0) goto LAB_00129272;
      iVar4 = strcmp(pcVar8,"gen_attr");
      if (iVar4 == 0) goto LAB_00129272;
LAB_001292af:
      iVar4 = strcmp(pcVar8,"testAttrFloatVectors");
      if (iVar4 == 0) goto LAB_001292d5;
      iVar4 = strcmp(pcVar8,"gen_attr");
      if (iVar4 == 0) goto LAB_001292d5;
LAB_00129312:
      iVar4 = strcmp(pcVar8,"testAttrChlists");
      if (iVar4 == 0) goto LAB_00129338;
      iVar4 = strcmp(pcVar8,"gen_attr");
      if (iVar4 == 0) goto LAB_00129338;
LAB_00129375:
      iVar4 = strcmp(pcVar8,"testAttrPreview");
      if (iVar4 == 0) goto LAB_0012939b;
      iVar4 = strcmp(pcVar8,"gen_attr");
      if (iVar4 == 0) goto LAB_0012939b;
LAB_001293d8:
      iVar4 = strcmp(pcVar8,"testAttrOpaque");
      if (iVar4 == 0) goto LAB_001293fe;
      iVar4 = strcmp(pcVar8,"gen_attr");
      if (iVar4 == 0) goto LAB_001293fe;
LAB_0012943b:
      iVar4 = strcmp(pcVar8,"testAttrHandler");
      if (iVar4 == 0) goto LAB_00129461;
      iVar4 = strcmp(pcVar8,"gen_attr");
      if (iVar4 == 0) goto LAB_00129461;
LAB_0012949e:
      iVar4 = strcmp(pcVar8,"testAttrLists");
      if (iVar4 == 0) goto LAB_001294c4;
      iVar4 = strcmp(pcVar8,"gen_attr");
      if (iVar4 == 0) goto LAB_001294c4;
LAB_00129501:
      iVar4 = strcmp(pcVar8,"testReadBadArgs");
      if (iVar4 == 0) goto LAB_00129527;
      iVar4 = strcmp(pcVar8,"core_read");
      if (iVar4 == 0) goto LAB_00129527;
LAB_00129564:
      iVar4 = strcmp(pcVar8,"testReadBadFiles");
      if (iVar4 == 0) goto LAB_0012958a;
      iVar4 = strcmp(pcVar8,"core_read");
      if (iVar4 == 0) goto LAB_0012958a;
LAB_001295c7:
      iVar4 = strcmp(pcVar8,"testReadMeta");
      if (iVar4 == 0) goto LAB_001295ed;
      iVar4 = strcmp(pcVar8,"core_read");
      if (iVar4 == 0) goto LAB_001295ed;
LAB_0012962a:
      iVar4 = strcmp(pcVar8,"testOpenScans");
      if (iVar4 == 0) goto LAB_00129650;
      iVar4 = strcmp(pcVar8,"core_read");
      if (iVar4 == 0) goto LAB_00129650;
LAB_0012968d:
      iVar4 = strcmp(pcVar8,"testOpenTiles");
      if (iVar4 == 0) goto LAB_001296b3;
      iVar4 = strcmp(pcVar8,"core_read");
      if (iVar4 == 0) goto LAB_001296b3;
LAB_001296f0:
      iVar4 = strcmp(pcVar8,"testOpenMultiPart");
      if (iVar4 == 0) goto LAB_00129716;
      iVar4 = strcmp(pcVar8,"core_read");
      if (iVar4 == 0) goto LAB_00129716;
LAB_00129753:
      iVar4 = strcmp(pcVar8,"testOpenDeep");
      if (iVar4 == 0) goto LAB_00129779;
      iVar4 = strcmp(pcVar8,"core_read");
      if (iVar4 == 0) goto LAB_00129779;
LAB_001297b6:
      iVar4 = strcmp(pcVar8,"testReadScans");
      if (iVar4 == 0) goto LAB_001297dc;
      iVar4 = strcmp(pcVar8,"core_read");
      if (iVar4 == 0) goto LAB_001297dc;
LAB_00129819:
      iVar4 = strcmp(pcVar8,"testReadTiles");
      if (iVar4 == 0) goto LAB_0012983f;
      iVar4 = strcmp(pcVar8,"core_read");
      if (iVar4 == 0) goto LAB_0012983f;
LAB_0012987c:
      iVar4 = strcmp(pcVar8,"testReadMultiPart");
      if (iVar4 == 0) goto LAB_001298a2;
      iVar4 = strcmp(pcVar8,"core_read");
      if (iVar4 == 0) goto LAB_001298a2;
LAB_001298df:
      iVar4 = strcmp(pcVar8,"testReadDeep");
      if (iVar4 == 0) goto LAB_00129905;
      iVar4 = strcmp(pcVar8,"core_read");
      if (iVar4 == 0) goto LAB_00129905;
LAB_00129942:
      iVar4 = strcmp(pcVar8,"testReadUnpack");
      if (iVar4 == 0) goto LAB_00129968;
      iVar4 = strcmp(pcVar8,"core_read");
      if (iVar4 == 0) goto LAB_00129968;
LAB_001299a5:
      iVar4 = strcmp(pcVar8,"testWriteBadArgs");
      if (iVar4 == 0) goto LAB_001299cb;
      iVar4 = strcmp(pcVar8,"core_write");
      if (iVar4 == 0) goto LAB_001299cb;
LAB_00129a08:
      iVar4 = strcmp(pcVar8,"testWriteBadFiles");
      if (iVar4 == 0) goto LAB_00129a2e;
      iVar4 = strcmp(pcVar8,"core_write");
      if (iVar4 == 0) goto LAB_00129a2e;
LAB_00129a6b:
      iVar4 = strcmp(pcVar8,"testUpdateMeta");
      if (iVar4 == 0) goto LAB_00129a91;
      iVar4 = strcmp(pcVar8,"core_write");
      if (iVar4 == 0) goto LAB_00129a91;
LAB_00129ace:
      iVar4 = strcmp(pcVar8,"testWriteBaseHeader");
      if (iVar4 == 0) goto LAB_00129af4;
      iVar4 = strcmp(pcVar8,"core_write");
      if (iVar4 == 0) goto LAB_00129af4;
LAB_00129b31:
      iVar4 = strcmp(pcVar8,"testWriteAttrs");
      if (iVar4 == 0) goto LAB_00129b57;
      iVar4 = strcmp(pcVar8,"core_write");
      if (iVar4 == 0) goto LAB_00129b57;
LAB_00129b94:
      iVar4 = strcmp(pcVar8,"testStartWriteScan");
      if (iVar4 == 0) goto LAB_00129bba;
      iVar4 = strcmp(pcVar8,"core_write");
      if (iVar4 == 0) goto LAB_00129bba;
LAB_00129bf7:
      iVar4 = strcmp(pcVar8,"testStartWriteTile");
      if (iVar4 == 0) goto LAB_00129c1d;
      iVar4 = strcmp(pcVar8,"core_write");
      if (iVar4 == 0) goto LAB_00129c1d;
LAB_00129c5a:
      iVar4 = strcmp(pcVar8,"testStartWriteDeepScan");
      if (iVar4 == 0) goto LAB_00129c80;
      iVar4 = strcmp(pcVar8,"core_write");
      if (iVar4 == 0) goto LAB_00129c80;
LAB_00129cbd:
      iVar4 = strcmp(pcVar8,"testStartWriteDeepTile");
      if (iVar4 == 0) goto LAB_00129ce3;
      iVar4 = strcmp(pcVar8,"core_write");
      if (iVar4 == 0) goto LAB_00129ce3;
LAB_00129d20:
      iVar4 = strcmp(pcVar8,"testWriteScans");
      if (iVar4 == 0) goto LAB_00129d46;
      iVar4 = strcmp(pcVar8,"core_write");
      if (iVar4 == 0) goto LAB_00129d46;
LAB_00129d83:
      iVar4 = strcmp(pcVar8,"testWriteTiles");
      if (iVar4 == 0) goto LAB_00129da9;
      iVar4 = strcmp(pcVar8,"core_write");
      if (iVar4 == 0) goto LAB_00129da9;
LAB_00129de6:
      iVar4 = strcmp(pcVar8,"testWriteMultiPart");
      if (iVar4 == 0) goto LAB_00129e0c;
      iVar4 = strcmp(pcVar8,"core_write");
      if (iVar4 == 0) goto LAB_00129e0c;
LAB_00129e49:
      iVar4 = strcmp(pcVar8,"testWriteDeep");
      if (iVar4 == 0) goto LAB_00129e6f;
      iVar4 = strcmp(pcVar8,"core_write");
      if (iVar4 == 0) goto LAB_00129e6f;
LAB_00129eac:
      iVar4 = strcmp(pcVar8,"testHUF");
      if (iVar4 == 0) goto LAB_00129ed2;
      iVar4 = strcmp(pcVar8,"core_compression");
      if (iVar4 == 0) goto LAB_00129ed2;
LAB_00129f0f:
      iVar4 = strcmp(pcVar8,"testNoCompression");
      if (iVar4 == 0) goto LAB_00129f35;
      iVar4 = strcmp(pcVar8,"core_compression");
      if (iVar4 == 0) goto LAB_00129f35;
LAB_00129f72:
      iVar4 = strcmp(pcVar8,"testRLECompression");
      if (iVar4 == 0) goto LAB_00129f98;
      iVar4 = strcmp(pcVar8,"core_compression");
      if (iVar4 == 0) goto LAB_00129f98;
LAB_00129fd5:
      iVar4 = strcmp(pcVar8,"testZIPCompression");
      if (iVar4 == 0) goto LAB_00129ffb;
      iVar4 = strcmp(pcVar8,"core_compression");
      if (iVar4 == 0) goto LAB_00129ffb;
LAB_0012a038:
      iVar4 = strcmp(pcVar8,"testZIPSCompression");
      if (iVar4 == 0) goto LAB_0012a05e;
      iVar4 = strcmp(pcVar8,"core_compression");
      if (iVar4 == 0) goto LAB_0012a05e;
LAB_0012a09b:
      iVar4 = strcmp(pcVar8,"testPIZCompression");
      if (iVar4 == 0) goto LAB_0012a0c1;
      iVar4 = strcmp(pcVar8,"core_compression");
      if (iVar4 == 0) goto LAB_0012a0c1;
LAB_0012a0fe:
      iVar4 = strcmp(pcVar8,"testPXR24Compression");
      if (iVar4 == 0) goto LAB_0012a124;
      iVar4 = strcmp(pcVar8,"core_compression");
      if (iVar4 == 0) goto LAB_0012a124;
LAB_0012a161:
      iVar4 = strcmp(pcVar8,"testB44Compression");
      if (iVar4 == 0) goto LAB_0012a187;
      iVar4 = strcmp(pcVar8,"core_compression");
      if (iVar4 == 0) goto LAB_0012a187;
LAB_0012a1c4:
      iVar4 = strcmp(pcVar8,"testB44ACompression");
      if (iVar4 == 0) goto LAB_0012a1ea;
      iVar4 = strcmp(pcVar8,"core_compression");
      if (iVar4 == 0) goto LAB_0012a1ea;
LAB_0012a227:
      iVar4 = strcmp(pcVar8,"testDWAACompression");
      if (iVar4 == 0) goto LAB_0012a24d;
      iVar4 = strcmp(pcVar8,"core_compression");
      if (iVar4 == 0) goto LAB_0012a24d;
LAB_0012a28a:
      iVar4 = strcmp(pcVar8,"testDWABCompression");
      if (iVar4 == 0) goto LAB_0012a2b0;
      iVar4 = strcmp(pcVar8,"core_compression");
      if (iVar4 == 0) goto LAB_0012a2b0;
LAB_0012a2ed:
      iVar4 = strcmp(pcVar8,"testDeepNoCompression");
      if (iVar4 == 0) goto LAB_0012a313;
      iVar4 = strcmp(pcVar8,"core_compression");
      if (iVar4 == 0) goto LAB_0012a313;
LAB_0012a350:
      iVar4 = strcmp(pcVar8,"testDeepZIPCompression");
      if (iVar4 == 0) goto LAB_0012a376;
      iVar4 = strcmp(pcVar8,"core_compression");
      if (iVar4 == 0) goto LAB_0012a376;
LAB_0012a3b3:
      iVar4 = strcmp(pcVar8,"testDeepZIPSCompression");
      if (iVar4 == 0) goto LAB_0012a3d9;
      iVar4 = strcmp(pcVar8,"core_compression");
      if (iVar4 == 0) goto LAB_0012a3d9;
    }
    poVar5 = std::operator<<((ostream *)&std::cout,"removing temp dir ");
    poVar5 = std::operator<<(poVar5,(string *)&tempDir);
    std::endl<char,std::char_traits<char>>(poVar5);
    iVar4 = rmdir(tempDir._M_dataplus._M_p);
    if (iVar4 != 0) {
      piVar7 = __errno_location();
      if (*piVar7 == 0x27) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Temp dir ");
        poVar5 = std::operator<<(poVar5,(string *)&tempDir);
        poVar5 = std::operator<<(poVar5," not empty");
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Error removing dir ");
        poVar5 = std::operator<<(poVar5,(string *)&tempDir);
        poVar5 = std::operator<<(poVar5,": ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
      }
      std::endl<char,std::char_traits<char>>(poVar5);
      iVar4 = 1;
      goto LAB_0012a538;
    }
  }
  iVar4 = 0;
LAB_0012a538:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&suites._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&tests._M_t);
  std::__cxx11::string::~string((string *)&tempDir);
  return iVar4;
}

Assistant:

int
main (int argc, char* argv[])
{
    // Create temporary files in a uniquely named private temporary
    // subdirectory of IMF_TMP_DIR to avoid colliding with other
    // running instances of this program.

    std::string tempDir;

    bool helpMode = false;
    if (argc == 2 &&
        (strcmp (argv[1], "--help") == 0 || strcmp (argv[1], "-h") == 0))
    {
        helpMode = true;
    }
    std::set<std::string> tests;
    std::set<std::string> suites;

    if (!helpMode) { tempDir = makeTempDir (); }

    TEST (testBase, "core");
    TEST (testBaseErrors, "core");
    TEST (testBaseLimits, "core");
    TEST (testBaseDebug, "core");
    TEST (testXDR, "core");
    TEST (testBufferCompression, "core");

    TEST (testAttrSizes, "gen_attr");
    TEST (testAttrStrings, "gen_attr");
    TEST (testAttrStringVectors, "gen_attr");
    TEST (testAttrFloatVectors, "gen_attr");
    TEST (testAttrChlists, "gen_attr");
    TEST (testAttrPreview, "gen_attr");
    TEST (testAttrOpaque, "gen_attr");
    TEST (testAttrHandler, "gen_attr");
    TEST (testAttrLists, "gen_attr");

    TEST (testReadBadArgs, "core_read");
    TEST (testReadBadFiles, "core_read");
    TEST (testReadMeta, "core_read");
    TEST (testOpenScans, "core_read");
    TEST (testOpenTiles, "core_read");
    TEST (testOpenMultiPart, "core_read");
    TEST (testOpenDeep, "core_read");
    TEST (testReadScans, "core_read");
    TEST (testReadTiles, "core_read");
    TEST (testReadMultiPart, "core_read");
    TEST (testReadDeep, "core_read");
    TEST (testReadUnpack, "core_read");

    TEST (testWriteBadArgs, "core_write");
    TEST (testWriteBadFiles, "core_write");
    TEST (testUpdateMeta, "core_write");
    TEST (testWriteBaseHeader, "core_write");
    TEST (testWriteAttrs, "core_write");
    TEST (testStartWriteScan, "core_write");
    TEST (testStartWriteTile, "core_write");
    TEST (testStartWriteDeepScan, "core_write");
    TEST (testStartWriteDeepTile, "core_write");
    TEST (testWriteScans, "core_write");
    TEST (testWriteTiles, "core_write");
    TEST (testWriteMultiPart, "core_write");
    TEST (testWriteDeep, "core_write");

    TEST (testHUF, "core_compression");
    TEST (testNoCompression, "core_compression");
    TEST (testRLECompression, "core_compression");
    TEST (testZIPCompression, "core_compression");
    TEST (testZIPSCompression, "core_compression");
    TEST (testPIZCompression, "core_compression");
    TEST (testPXR24Compression, "core_compression");
    TEST (testB44Compression, "core_compression");
    TEST (testB44ACompression, "core_compression");
    TEST (testDWAACompression, "core_compression");
    TEST (testDWABCompression, "core_compression");

    TEST (testDeepNoCompression, "core_compression");
    TEST (testDeepZIPCompression, "core_compression");
    TEST (testDeepZIPSCompression, "core_compression");

    if (helpMode)
    {
        std::cout
            << "OpenEXR Core Test runs a series of tests to confirm\n"
               "correct behavior of the core low-level OpenEXR library.\n"
               "If all is correct, OpenEXRCoreTest will complete without\n"
               "crashing or leaking memory.\n";
        std::cout << "\n";
        std::cout
            << "If a test fails, an individual test can be re-run, avoiding\n"
               "the wait for previous tests to complete. This allows easier debugging\n"
               "of the failure.\n";
        std::cout << "\n";
        std::cout
            << "A 'suite' of tests can also be run, to allow a subset of\n"
            << "tests to run. This is useful as an initial confirmation\n"
            << "that a modification to the library has not introduced an error.\n"
            << "Suites can be run in parallel for speed. Every test is in one suite.\n";
        std::cout << "\n";
        std::cout
            << "usage:\n"
            << "OpenEXRCoreTest           : with no arguments, run all tests\n"
            << "OpenEXRCoreTest TEST      : run only specific test, then quit\n"
            << "OpenEXRCoreTest SUITE     : run all the tests in the given SUITE\n";
        std::cout << "\n";
        std::cout << "available TESTs:\n";
        for (auto i = tests.begin (); i != tests.end (); ++i)
        {
            std::cout << ' ' << *i << std::endl;
        }
        std::cout << "\n";
        std::cout << "available SUITEs:\n";
        for (auto i = suites.begin (); i != suites.end (); ++i)
        {
            std::cout << ' ' << *i << std::endl;
        }
    }
    else
    {
        std::cout << "removing temp dir " << tempDir << std::endl;
        int rv = rmdir (tempDir.c_str ());
        if (rv != 0)
        {
            if (errno == ENOTEMPTY)
                std::cerr << "Temp dir " << tempDir << " not empty"
                          << std::endl;
            else
                std::cerr << "Error removing dir " << tempDir << ": " << rv
                          << std::endl;
            return 1;
        }

#ifdef OPENEXR_IMF_HAVE_LINUX_PROCFS

        //
        // Allow the user to check for file descriptor leaks
        //

        std::cout << "open file descriptors:" << std::endl;

        std::stringstream ss;
        ss << "ls -lG /proc/" << getpid () << "/fd";

        if (system (ss.str ().c_str ()) == -1)
        {
            std::cout << "failed to run ls\n";
        }

        std::cout << endl;

#endif
    }
    return 0;
}